

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_test.cc
# Opt level: O1

void __thiscall
xLearn::LossTest_Predict_FM_Test::~LossTest_Predict_FM_Test(LossTest_Predict_FM_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(LossTest, Predict_FM) {
  // Create Model for FM
  Model model_fm;
  param.score_func = "fm";
  model_fm.Initialize(param.score_func,
                  param.loss_func,
                  param.num_feature,
                  param.num_field,
                  param.num_K,
                  param.auxiliary_size);
  real_t* w = model_fm.GetParameter_w();
  index_t num_w = model_fm.GetNumParameter_w();
  for (size_t i = 0; i < num_w; ++i) {
    w[i] = 2.0;
  }
  real_t* v = model_fm.GetParameter_v();
  index_t num_v = model_fm.GetNumParameter_v();
  for (size_t i = 0; i < num_v; ++i) {
    v[i] = 1.0;
  }
  // Create Data matrix
  DMatrix matrix;
  matrix.ReAlloc(kLine);
  for (int i = 0; i < kLine; ++i) {
    matrix.Y[i] = 0;
    matrix.row[i] = new SparseRow;
    for (int j = 0; j < param.num_feature; ++j) {
      matrix.AddNode(i, j, 1.0);
    }
  }
  // Create loss function
  TestLoss loss;
  Score* score = new FMScore;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  loss.Initialize(score, pool);
  // Test
  std::vector<real_t> pred(kLine);
  loss.Predict(&matrix, model_fm, pred);
  for (int i = 0; i < kLine; ++i) {
    // 6 + 24*1*3
    EXPECT_FLOAT_EQ(pred[i], 78);
  }
}